

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O2

void __thiscall CombinedH264Reader::fillPids(CombinedH264Reader *this,PIDSet *acceptedPIDs,int pid)

{
  _Rb_tree_header *p_Var1;
  const_iterator cVar2;
  
  this->m_mvcStreamIndex = pid * 0x10000 + 1;
  this->m_avcStreamIndex = pid * 0x10000 | 2;
  cVar2 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                    (&acceptedPIDs->_M_t,&this->m_mvcStreamIndex);
  p_Var1 = &(acceptedPIDs->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node == p_Var1) {
    this->m_mvcStreamIndex = -1;
  }
  cVar2 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                    (&acceptedPIDs->_M_t,&this->m_avcStreamIndex);
  if ((_Rb_tree_header *)cVar2._M_node == p_Var1) {
    this->m_avcStreamIndex = -1;
  }
  return;
}

Assistant:

void CombinedH264Reader::fillPids(const PIDSet& acceptedPIDs, const int pid)
{
    m_mvcStreamIndex = SubTrackFilter::pidToSubPid(pid, MVC_STREAM_INDEX);
    m_avcStreamIndex = SubTrackFilter::pidToSubPid(pid, AVC_STREAM_INDEX);
    if (acceptedPIDs.find(m_mvcStreamIndex) == acceptedPIDs.end())
        m_mvcStreamIndex = -1;
    if (acceptedPIDs.find(m_avcStreamIndex) == acceptedPIDs.end())
        m_avcStreamIndex = -1;
}